

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O3

string * __thiscall font2svg::glyph::labelpts_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  undefined1 *puVar1;
  ostream *poVar2;
  long lVar3;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (0 < (this->ftoutline).n_points) {
    puVar1 = &this->field_0x270;
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,
                 "\n <g font-family=\'SVGFreeSansASCII,sans-serif\' font-size=\'10\'>\n",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,"  <text id=\'revision\'",0x15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," x=\'",4);
      poVar2 = std::ostream::_M_insert<long>((long)puVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," y=\'",4);
      poVar2 = std::ostream::_M_insert<long>((long)puVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1," stroke=\'none\' fill=\'darkgreen\'>\n",0x21);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"  ",2);
      poVar2 = std::ostream::_M_insert<long>((long)puVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
      std::ostream::_M_insert<long>((long)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"  </text>\n",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," </g>\n",6);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->ftoutline).n_points);
  }
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string labelpts() {
		tmp.str("");
		for ( int i = 0 ; i < ftoutline.n_points ; i++ ) {
			tmp << "\n <g font-family='SVGFreeSansASCII,sans-serif' font-size='10'>\n";
			tmp << "  <text id='revision'";
			tmp << " x='" << ftpoints[i].x + 5 << "'";
			tmp << " y='" << ftpoints[i].y - 5 << "'";
			tmp << " stroke='none' fill='darkgreen'>\n";
			tmp << "  " << ftpoints[i].x  << "," << ftpoints[i].y;
			tmp << "  </text>\n";
			tmp << " </g>\n";
		}
		return tmp.str();
	}